

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O3

double units::puconversion::knownConversions(double val,unit_data *start,unit_data *result)

{
  uint uVar1;
  double dVar2;
  
  uVar1 = (uint)*start & 0xfffffff;
  dVar2 = NAN;
  if (uVar1 == 0x1d2) {
    uVar1 = (uint)*result & 0xfffffff;
    if (uVar1 == 0x800) {
      return val;
    }
  }
  else {
    if (uVar1 != 0x800) {
      if (uVar1 != 0x31d2) {
        return dVar2;
      }
      if ((((uint)*result & 0xfffffff) != 0x800) && (((uint)*result & 0xfffffff) != 0x1d2)) {
        return dVar2;
      }
      goto LAB_001761a0;
    }
    uVar1 = (uint)*result & 0xfffffff;
    if (uVar1 == 0x1d2) {
      return val;
    }
  }
  if (uVar1 != 0x31d2) {
    return dVar2;
  }
LAB_001761a0:
  return 1.0 / val;
}

Assistant:

inline double knownConversions(
        double val,
        const detail::unit_data& start,
        const detail::unit_data& result)
    {
        if (start.has_same_base(puOhm.base_units())) {
            if (result.has_same_base(puMW.base_units()) ||
                result.has_same_base(puA.base_units())) {  // V^2/R assuming
                                                           // voltage=1.0 pu; or
                                                           // //I=V/R
                return 1.0 / val;
            }
        } else if (start.has_same_base(puA.base_units())) {
            if (result.has_same_base(puMW.base_units())) {  // P=IV assuming
                                                            // voltage=1.0 pu or
                                                            // //R=V/I
                return val;
            }
            if (result.has_same_base(
                    puOhm.base_units())) {  // P=IV assuming
                                            // voltage=1.0 pu or
                                            // //R=V/I
                return 1.0 / val;
            }
        } else if (start.has_same_base(
                       puMW.base_units())) {  // P=IV, or P=V^2/R
            if (result.has_same_base(
                    puA.base_units())) {  // IV assuming voltage=1.0 pu or
                return val;
            }
            if (result.has_same_base(puOhm.base_units())) {
                return 1.0 / val;
            }
        }
        return constants::invalid_conversion;
    }